

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceCacheGL.hpp
# Opt level: O0

void __thiscall
Diligent::ShaderResourceCacheGL::CachedResourceView::Set
          (CachedResourceView *this,RefCntAutoPtr<Diligent::TextureViewGLImpl> *pTexView,
          bool SetSampler)

{
  bool bVar1;
  TextureViewGLImpl *pTVar2;
  SamplerGLImpl *pSVar3;
  TextureBaseGL *local_30;
  bool SetSampler_local;
  RefCntAutoPtr<Diligent::TextureViewGLImpl> *pTexView_local;
  CachedResourceView *this_local;
  
  bVar1 = Diligent::RefCntAutoPtr::operator_cast_to_bool((RefCntAutoPtr *)pTexView);
  if (bVar1) {
    pTVar2 = RefCntAutoPtr<Diligent::TextureViewGLImpl>::operator->(pTexView);
    local_30 = TextureViewBase<Diligent::EngineGLImplTraits>::GetTexture<Diligent::TextureBaseGL>
                         (&pTVar2->super_TextureViewBase<Diligent::EngineGLImplTraits>);
  }
  else {
    local_30 = (TextureBaseGL *)0x0;
  }
  this->pTexture = local_30;
  bVar1 = Diligent::RefCntAutoPtr::operator_cast_to_bool((RefCntAutoPtr *)pTexView);
  if ((bVar1) && (SetSampler)) {
    pTVar2 = RefCntAutoPtr<Diligent::TextureViewGLImpl>::operator->(pTexView);
    pSVar3 = TextureViewBase<Diligent::EngineGLImplTraits>::GetSampler<Diligent::SamplerGLImpl>
                       (&pTVar2->super_TextureViewBase<Diligent::EngineGLImplTraits>);
    (this->field_2).pSampler = pSVar3;
  }
  RefCntAutoPtr<Diligent::IDeviceObject>::operator=(&this->pView,pTexView);
  return;
}

Assistant:

void Set(RefCntAutoPtr<TextureViewGLImpl>&& pTexView, bool SetSampler)
        {
            // Do not null out pSampler as it could've been initialized by PipelineResourceSignatureGLImpl::InitSRBResourceCache!
            // pSampler = nullptr;

            // Avoid unnecessary virtual call
            pTexture = pTexView ? pTexView->GetTexture<TextureBaseGL>() : nullptr;
            if (pTexView && SetSampler)
            {
                pSampler = pTexView->GetSampler<SamplerGLImpl>();
            }

            pView = std::move(pTexView);
        }